

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall
trackerboy::apu::Hardware::setMix(Hardware *this,ChannelMix *mix,Mixer *mixer,uint32_t cycletime)

{
  byte bVar1;
  MixMode mode;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  byte *pbVar8;
  float fVar9;
  float local_4c;
  float level;
  float dcRight;
  float dcLeft;
  int changes;
  value_type *last;
  ulong uStack_30;
  value_type next;
  size_t i;
  uint32_t cycletime_local;
  Mixer *mixer_local;
  ChannelMix *mix_local;
  Hardware *this_local;
  
  for (uStack_30 = 0; sVar5 = std::array<trackerboy::apu::MixMode,_4UL>::size(&this->mMix),
      uStack_30 < sVar5; uStack_30 = uStack_30 + 1) {
    pvVar6 = std::array<trackerboy::apu::MixMode,_4UL>::operator[](mix,uStack_30);
    mode = *pvVar6;
    pvVar7 = std::array<trackerboy::apu::MixMode,_4UL>::operator[](&this->mMix,uStack_30);
    if (mode != *pvVar7) {
      uVar3 = operator+(*pvVar7);
      uVar4 = operator+(mode);
      level = 0.0;
      local_4c = 0.0;
      pbVar8 = std::array<unsigned_char,_4UL>::operator[](&this->mLastOutputs,uStack_30);
      bVar1 = *pbVar8;
      if (((uVar3 ^ uVar4) & 2) != 0) {
        fVar9 = Mixer::leftVolume(mixer);
        level = fVar9 * (7.5 - (float)bVar1);
        bVar2 = modePansLeft(mode);
        if (bVar2) {
          level = -level;
        }
      }
      if (((uVar3 ^ uVar4) & 1) != 0) {
        local_4c = Mixer::rightVolume(mixer);
        local_4c = local_4c * (7.5 - (float)bVar1);
        bVar2 = modePansRight(mode);
        if (bVar2) {
          local_4c = -local_4c;
        }
      }
      Mixer::mixDc(mixer,level,local_4c,cycletime);
    }
  }
  *(undefined8 *)(this->mMix)._M_elems = *(undefined8 *)mix->_M_elems;
  *(undefined8 *)((this->mMix)._M_elems + 2) = *(undefined8 *)(mix->_M_elems + 2);
  return;
}

Assistant:

void Hardware::setMix(const ChannelMix &mix, Mixer &mixer, uint32_t cycletime) noexcept {

    // check for changes in the mix
    for (size_t i = 0; i < mMix.size(); ++i) {
        auto const next = mix[i];
        auto &last = mMix[i];

        if (next != last) {
            auto changes = +last ^ +next;

            float dcLeft = 0.0f;
            float dcRight = 0.0f;
            auto const level = 7.5f - mLastOutputs[i];
            if (changes & MIX_LEFT) {
                dcLeft = mixer.leftVolume() * level;
                if (modePansLeft(next)) {
                    dcLeft = -dcLeft;
                }
            }

            if (changes & MIX_RIGHT) {
                dcRight = mixer.rightVolume() * level;
                if (modePansRight(next)) {
                    dcRight = -dcRight;
                }
            }

            mixer.mixDc(dcLeft, dcRight, cycletime);
        }
    }


    mMix = mix;
}